

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O0

void __thiscall deqp::gls::BufferTestUtil::BufferCase::checkError(BufferCase *this)

{
  TestError *this_00;
  Enum<int,_2UL> EVar1;
  GetNameFunc local_a0;
  int local_98;
  string local_90;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  GLenum local_14;
  BufferCase *pBStack_10;
  GLenum err;
  BufferCase *this_local;
  
  pBStack_10 = this;
  local_14 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
  if (local_14 != 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Got ",&local_59);
    EVar1 = glu::getErrorStr(local_14);
    local_a0 = EVar1.m_getName;
    local_98 = EVar1.m_value;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_a0);
    std::operator+(&local_38,&local_58,&local_90);
    tcu::TestError::TestError(this_00,&local_38);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void BufferCase::checkError (void)
{
	glw::GLenum err = glGetError();
	if (err != GL_NO_ERROR)
		throw tcu::TestError(string("Got ") + glu::getErrorStr(err).toString());
}